

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint32 ma_pcm_rb_get_subbuffer_offset(ma_pcm_rb *pRB,ma_uint32 subbufferIndex)

{
  uint uVar1;
  
  if (pRB != (ma_pcm_rb *)0x0) {
    uVar1 = (pRB->rb).subbufferStrideInBytes;
    if (uVar1 == 0) {
      uVar1 = (pRB->rb).subbufferSizeInBytes;
    }
    return (ma_uint32)
           (((ulong)uVar1 * (ulong)subbufferIndex) /
           (ulong)(*(int *)(&DAT_0017b4a0 + (ulong)pRB->format * 4) * pRB->channels));
  }
  return 0;
}

Assistant:

MA_API ma_uint32 ma_pcm_rb_get_subbuffer_offset(ma_pcm_rb* pRB, ma_uint32 subbufferIndex)
{
    if (pRB == NULL) {
        return 0;
    }

    return (ma_uint32)(ma_rb_get_subbuffer_offset(&pRB->rb, subbufferIndex) / ma_pcm_rb_get_bpf(pRB));
}